

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O1

bool __thiscall
cmTargetPropCommandBase::PopulateTargetProperies
          (cmTargetPropCommandBase *this,string *scope,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)scope);
  if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)scope), iVar1 == 0)) &&
     (iVar1 = (*(this->super_cmCommand)._vptr_cmCommand[10])
                        (this,this->Target,content,(ulong)prepend,(ulong)system),
     (char)iVar1 == '\0')) {
    return false;
  }
  iVar1 = std::__cxx11::string::compare((char *)scope);
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)scope), iVar1 != 0)) {
    return true;
  }
  (*(this->super_cmCommand)._vptr_cmCommand[7])
            (this,this->Target,content,(ulong)prepend,(ulong)system);
  return true;
}

Assistant:

bool cmTargetPropCommandBase::PopulateTargetProperies(
  const std::string& scope, const std::vector<std::string>& content,
  bool prepend, bool system)
{
  if (scope == "PRIVATE" || scope == "PUBLIC") {
    if (!this->HandleDirectContent(this->Target, content, prepend, system)) {
      return false;
    }
  }
  if (scope == "INTERFACE" || scope == "PUBLIC") {
    this->HandleInterfaceContent(this->Target, content, prepend, system);
  }
  return true;
}